

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O2

void htable_fini(HTABLE *htable,_func_void_HTABLE_NODE_ptr *dtor_func)

{
  void *pvVar1;
  HTABLE_NODE *pHVar2;
  long lVar3;
  uint i;
  ulong uVar4;
  
  if ((dtor_func != (_func_void_HTABLE_NODE_ptr *)0x0) && (htable->n != 0)) {
    for (uVar4 = 0; uVar4 < (uint)htable->n_planes; uVar4 = uVar4 + 1) {
      pvVar1 = htable->planes[uVar4];
      for (lVar3 = 0; lVar3 != 0x3b << ((byte)uVar4 & 0x1f); lVar3 = lVar3 + 1) {
        while (pHVar2 = *(HTABLE_NODE **)((long)pvVar1 + lVar3 * 8), pHVar2 != (HTABLE_NODE *)0x0) {
          *(HTABLE_NODE **)((long)pvVar1 + lVar3 * 8) = pHVar2->next;
          (*dtor_func)(pHVar2);
        }
      }
    }
  }
  htable->n = 0;
  htable_free_all_planes(htable);
  return;
}

Assistant:

void
htable_fini(HTABLE* htable, void (*dtor_func)(HTABLE_NODE*))
{
    if(dtor_func != NULL  &&  htable->n > 0) {
        unsigned i;
        size_t index;

        for(i = 0; i < htable->n_planes; i++) {
            HTABLE_NODE** plane = (HTABLE_NODE**) htable->planes[i];
            for(index = 0; index < HTABLE_PLANE_SIZE(i); index++) {
                while(plane[index] != NULL) {
                    HTABLE_NODE* node;

                    node = plane[index];
                    plane[index] = node->next;
                    dtor_func(node);
                }
            }
        }
    }
    htable->n = 0;

    htable_free_all_planes(htable);
}